

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessesView.cpp
# Opt level: O1

void __thiscall ProcessesView::onDataUpdated(ProcessesView *this)

{
  long lVar1;
  ProcessInfo *pPVar2;
  storage_type_conflict *psVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  QVector<ProcessInfo> *pQVar8;
  long *plVar9;
  long *plVar10;
  ulong uVar11;
  long lVar12;
  qsizetype *pqVar13;
  ulong uVar14;
  QString *pid_00;
  QStringView QVar15;
  QStringView QVar16;
  QString pid;
  anon_union_24_3_e3d07ef4_for_data local_b8;
  uint local_94;
  ProcessesView *local_90;
  ulong local_88;
  QVector<ProcessInfo> *local_80;
  QArrayData *local_78;
  storage_type_conflict *local_70;
  long local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined1 local_48 [24];
  
  QTreeView::setSortingEnabled(SUB81(this,0));
  pQVar8 = InfoProvider::getProcesses();
  plVar9 = (long *)QAbstractItemView::model();
  local_b8._forAlignment = -NAN;
  local_b8._8_8_ = 0;
  local_b8._16_8_ = 0;
  uVar5 = (**(code **)(*plVar9 + 0x78))(plVar9);
  if (0 < (int)uVar5) {
    uVar14 = (ulong)uVar5;
    local_90 = this;
    local_80 = pQVar8;
    do {
      uVar5 = (int)uVar14 - 1;
      uVar11 = (ulong)uVar5;
      local_88 = uVar14;
      plVar9 = (long *)QAbstractItemView::model();
      plVar10 = (long *)QAbstractItemView::model();
      local_60 = 0xffffffffffffffff;
      local_58 = 0;
      uStack_50 = 0;
      (**(code **)(*plVar10 + 0x60))(local_48,plVar10,uVar11,3,&local_60);
      (**(code **)(*plVar9 + 0x90))(&local_b8,plVar9,local_48,0);
      QVariant::toString();
      QVariant::~QVariant((QVariant *)&local_b8);
      lVar4 = local_68;
      psVar3 = local_70;
      lVar1 = (pQVar8->d).size;
      iVar6 = -1;
      if (0 < lVar1) {
        pqVar13 = &(((pQVar8->d).ptr)->pid).d.size;
        lVar12 = 0;
        local_94 = uVar5;
        do {
          if ((*pqVar13 == lVar4) &&
             (QVar15.m_data = (char16_t *)pqVar13[-1], QVar15.m_size = *pqVar13,
             QVar16.m_data = psVar3, QVar16.m_size = lVar4,
             iVar6 = QtPrivate::compareStrings(QVar15,QVar16,CaseSensitive), iVar6 == 0)) {
            iVar6 = (int)lVar12;
            break;
          }
          lVar12 = lVar12 + 1;
          pqVar13 = pqVar13 + 0x1b;
          iVar6 = -1;
        } while (lVar1 != lVar12);
        uVar11 = (ulong)local_94;
        pQVar8 = local_80;
      }
      this = local_90;
      if (iVar6 == -1) {
        plVar9 = (long *)QAbstractItemView::model();
        local_b8._forAlignment = -NAN;
        local_b8._8_8_ = 0;
        local_b8._16_8_ = 0;
        (**(code **)(*plVar9 + 0x108))(plVar9,uVar11,1,&local_b8);
      }
      else {
        pPVar2 = (pQVar8->d).ptr;
        QVariant::QVariant((QVariant *)&local_b8,(QString *)&pPVar2[iVar6].type);
        iVar7 = (int)uVar11;
        updateItem(local_90,iVar7,1,(QVariant *)&local_b8);
        QVariant::~QVariant((QVariant *)&local_b8);
        convertToInt((QVariant *)&local_b8,&pPVar2[iVar6].sm);
        this = local_90;
        updateItem(local_90,iVar7,5,(QVariant *)&local_b8);
        QVariant::~QVariant((QVariant *)&local_b8);
        convertToInt((QVariant *)&local_b8,&pPVar2[iVar6].mem);
        updateItem(this,iVar7,6,(QVariant *)&local_b8);
        QVariant::~QVariant((QVariant *)&local_b8);
        convertToInt((QVariant *)&local_b8,&pPVar2[iVar6].enc);
        updateItem(this,iVar7,7,(QVariant *)&local_b8);
        QVariant::~QVariant((QVariant *)&local_b8);
        convertToInt((QVariant *)&local_b8,&pPVar2[iVar6].dec);
        updateItem(this,iVar7,8,(QVariant *)&local_b8);
        QVariant::~QVariant((QVariant *)&local_b8);
        convertToInt((QVariant *)&local_b8,&pPVar2[iVar6].fbmem);
        updateItem(this,iVar7,4,(QVariant *)&local_b8);
        QVariant::~QVariant((QVariant *)&local_b8);
      }
      if (local_78 != (QArrayData *)0x0) {
        LOCK();
        (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_78,2,8);
        }
      }
      uVar14 = uVar11;
    } while (1 < (int)local_88);
  }
  plVar9 = (long *)QAbstractItemView::model();
  local_b8._forAlignment = -NAN;
  local_b8._8_8_ = 0;
  local_b8._16_8_ = 0;
  iVar6 = (**(code **)(*plVar9 + 0x78))(plVar9);
  lVar1 = (pQVar8->d).size;
  if (lVar1 != 0) {
    pPVar2 = (pQVar8->d).ptr;
    local_88 = lVar1 * 0xd8;
    uVar14 = 0;
    do {
      pid_00 = (QString *)((long)&(pPVar2->pid).d.d + uVar14);
      iVar7 = getRowIndexByPid(this,pid_00);
      if (iVar7 == -1) {
        QVariant::QVariant((QVariant *)&local_b8,(QString *)((long)&(pPVar2->name).d.d + uVar14));
        addItem(this,iVar6,0,(QVariant *)&local_b8);
        QVariant::~QVariant((QVariant *)&local_b8);
        QVariant::QVariant((QVariant *)&local_b8,(QString *)((long)&(pPVar2->type).d.d + uVar14));
        addItem(this,iVar6,1,(QVariant *)&local_b8);
        QVariant::~QVariant((QVariant *)&local_b8);
        convertToInt((QVariant *)&local_b8,(QString *)((long)&(pPVar2->gpuIdx).d.d + uVar14));
        addItem(this,iVar6,2,(QVariant *)&local_b8);
        QVariant::~QVariant((QVariant *)&local_b8);
        convertToInt((QVariant *)&local_b8,pid_00);
        addItem(this,iVar6,3,(QVariant *)&local_b8);
        QVariant::~QVariant((QVariant *)&local_b8);
        convertToInt((QVariant *)&local_b8,(QString *)((long)&(pPVar2->sm).d.d + uVar14));
        addItem(this,iVar6,5,(QVariant *)&local_b8);
        QVariant::~QVariant((QVariant *)&local_b8);
        convertToInt((QVariant *)&local_b8,(QString *)((long)&(pPVar2->mem).d.d + uVar14));
        addItem(this,iVar6,6,(QVariant *)&local_b8);
        QVariant::~QVariant((QVariant *)&local_b8);
        convertToInt((QVariant *)&local_b8,(QString *)((long)&(pPVar2->enc).d.d + uVar14));
        addItem(this,iVar6,7,(QVariant *)&local_b8);
        QVariant::~QVariant((QVariant *)&local_b8);
        convertToInt((QVariant *)&local_b8,(QString *)((long)&(pPVar2->dec).d.d + uVar14));
        addItem(this,iVar6,8,(QVariant *)&local_b8);
        QVariant::~QVariant((QVariant *)&local_b8);
        convertToInt((QVariant *)&local_b8,(QString *)((long)&(pPVar2->fbmem).d.d + uVar14));
        addItem(this,iVar6,4,(QVariant *)&local_b8);
        QVariant::~QVariant((QVariant *)&local_b8);
        iVar6 = iVar6 + 1;
      }
      uVar14 = uVar14 + 0xd8;
    } while (local_88 != uVar14);
  }
  QTreeView::setSortingEnabled(SUB81(this,0));
  return;
}

Assistant:

void ProcessesView::onDataUpdated() {
    // In order to avoid performance and other issues, sorting will be enabled after inserting
    // and updating the items in the tree: https://doc.qt.io/qt-5/qtreeview.html#sortingEnabled-prop
    setSortingEnabled(false);

    const auto &processes = InfoProvider::getProcesses();

    // update existing processes list & remove finished processes
    // loop from more to less in order to delete rows
    for (int i = model()->rowCount() - 1; i >= 0; i--) {
        QString pid = model()->data(model()->index(i, NVSMColumns::PID)).toString();

        int index = -1;

        for (int j = 0; j < processes.size(); ++j) {
            if (processes[j].pid == pid) {
                index = j;
                break;
            }
        }

        if (index == -1) {
            model()->removeRow(i);
        } else {
            const ProcessInfo &processInfo = processes[index];

            // update what may change
            updateItem(i, NVSMColumns::Type, processInfo.type);
            updateItem(i, NVSMColumns::Sm, convertToInt(processInfo.sm));
            updateItem(i, NVSMColumns::Mem, convertToInt(processInfo.mem));
            updateItem(i, NVSMColumns::Enc, convertToInt(processInfo.enc));
            updateItem(i, NVSMColumns::Dec, convertToInt(processInfo.dec));
            updateItem(i, NVSMColumns::FbMem, convertToInt(processInfo.fbmem));
        }
    }

    // add new processes to the list, if there are any
    int rowCount = model()->rowCount();
    for (auto &process : processes) {
        if (getRowIndexByPid(process.pid) == -1) {
            addItem(rowCount, NVSMColumns::Name, process.name);
            addItem(rowCount, NVSMColumns::Type, process.type);
            addItem(rowCount, NVSMColumns::GPUIdx, convertToInt(process.gpuIdx));
            addItem(rowCount, NVSMColumns::PID, convertToInt(process.pid));
            addItem(rowCount, NVSMColumns::Sm, convertToInt(process.sm));
            addItem(rowCount, NVSMColumns::Mem, convertToInt(process.mem));
            addItem(rowCount, NVSMColumns::Enc, convertToInt(process.enc));
            addItem(rowCount, NVSMColumns::Dec, convertToInt(process.dec));
            addItem(rowCount, NVSMColumns::FbMem, convertToInt(process.fbmem));

            rowCount++;
        }
    }

    setSortingEnabled(true);
}